

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O1

void Abc_TtMoveVar(word *pF,int nVars,int *V2P,int *P2V,int v,int p)

{
  word *pwVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  word wVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  word *pwVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  word *pwVar18;
  int iVar19;
  word *pwVar20;
  word *pwVar21;
  ulong uVar22;
  word *pLimit;
  
  iVar2 = V2P[v];
  if (iVar2 != p) {
    iVar19 = iVar2;
    if (iVar2 < p) {
      iVar19 = p;
    }
    iVar13 = iVar2;
    if (p < iVar2) {
      iVar13 = p;
    }
    if ((iVar19 <= iVar13) || (nVars <= iVar19)) {
      __assert_fail("iVar < jVar && jVar < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x692,"void Abc_TtSwapVars(word *, int, int, int)");
    }
    bVar6 = (byte)iVar13;
    if (nVars < 7) {
      uVar22 = *pF;
      bVar6 = (char)(-1 << (bVar6 & 0x1f)) + (char)(1 << ((byte)iVar19 & 0x1f));
      lVar9 = (long)iVar19;
      lVar12 = (long)iVar13 * 0x90;
      *pF = (uVar22 & *(ulong *)(lVar12 + 0x9d9a80 + lVar9 * 0x18)) >> (bVar6 & 0x3f) |
            (*(ulong *)(lVar12 + 0x9d9a78 + lVar9 * 0x18) & uVar22) << (bVar6 & 0x3f) |
            s_PPMasks[iVar13][lVar9][0] & uVar22;
    }
    else {
      iVar11 = nVars + -6;
      if (iVar19 < 6) {
        if (iVar11 != 0x1f) {
          uVar8 = 1 << ((byte)iVar11 & 0x1f);
          bVar6 = (char)(1 << ((byte)iVar19 & 0x1f)) + (char)(-1 << (bVar6 & 0x1f));
          lVar12 = (long)iVar19;
          lVar9 = (long)iVar13 * 0x90;
          uVar22 = s_PPMasks[iVar13][lVar12][0];
          uVar17 = *(ulong *)(lVar9 + 0x9d9a78 + lVar12 * 0x18);
          uVar15 = *(ulong *)(lVar9 + 0x9d9a80 + lVar12 * 0x18);
          if ((int)uVar8 < 2) {
            uVar8 = 1;
          }
          uVar14 = 0;
          do {
            uVar4 = pF[uVar14];
            pF[uVar14] = (uVar4 & uVar15) >> (bVar6 & 0x3f) |
                         (uVar4 & uVar17) << (bVar6 & 0x3f) | uVar4 & uVar22;
            uVar14 = uVar14 + 1;
          } while (uVar8 != uVar14);
        }
      }
      else {
        pwVar1 = pF + (1 << ((byte)iVar11 & 0x1f));
        if (iVar13 < 6) {
          if (iVar11 != 0x1f) {
            bVar7 = (byte)(iVar19 + -6);
            uVar8 = 1 << (bVar7 & 0x1f);
            iVar11 = 2 << (bVar7 & 0x1f);
            uVar22 = 1;
            if (1 < (int)uVar8) {
              uVar22 = (ulong)uVar8;
            }
            pwVar18 = pF + (int)uVar8;
            do {
              if (iVar19 + -6 != 0x1f) {
                uVar17 = s_Truths6[iVar13];
                uVar15 = 0;
                do {
                  uVar14 = pF[uVar15];
                  bVar7 = (byte)(1 << (bVar6 & 0x1f));
                  uVar4 = pwVar18[uVar15];
                  pF[uVar15] = uVar14 & ~uVar17 | uVar4 << (bVar7 & 0x3f) & uVar17;
                  pwVar18[uVar15] = uVar4 & uVar17 | (uVar14 & uVar17) >> (bVar7 & 0x3f);
                  uVar15 = uVar15 + 1;
                } while (uVar22 != uVar15);
              }
              pF = pF + iVar11;
              pwVar18 = pwVar18 + iVar11;
            } while (pF < pwVar1);
          }
        }
        else if (iVar11 != 0x1f) {
          bVar6 = (byte)(iVar19 + -6);
          bVar7 = (byte)(iVar13 + -6);
          uVar8 = 1 << (bVar7 & 0x1f);
          iVar11 = 2 << (bVar6 & 0x1f);
          uVar22 = 1;
          if (1 < (int)uVar8) {
            uVar22 = (ulong)uVar8;
          }
          lVar12 = (long)(2 << (bVar7 & 0x1f));
          lVar9 = (long)(1 << (bVar6 & 0x1f));
          pwVar18 = pF + lVar9;
          pwVar10 = pF + (int)uVar8;
          do {
            if (iVar19 + -6 != 0x1f) {
              lVar16 = 0;
              pwVar20 = pwVar18;
              pwVar21 = pwVar10;
              do {
                if (iVar13 + -6 != 0x1f) {
                  uVar17 = 0;
                  do {
                    wVar5 = pwVar21[uVar17];
                    pwVar21[uVar17] = pwVar20[uVar17];
                    pwVar20[uVar17] = wVar5;
                    uVar17 = uVar17 + 1;
                  } while (uVar22 != uVar17);
                }
                lVar16 = lVar16 + lVar12;
                pwVar20 = pwVar20 + lVar12;
                pwVar21 = pwVar21 + lVar12;
              } while (lVar16 < lVar9);
            }
            pF = pF + iVar11;
            pwVar18 = pwVar18 + iVar11;
            pwVar10 = pwVar10 + iVar11;
          } while (pF < pwVar1);
        }
      }
    }
    V2P[P2V[iVar2]] = p;
    V2P[P2V[p]] = iVar2;
    uVar8 = P2V[iVar2];
    uVar3 = P2V[p];
    P2V[iVar2] = uVar8 ^ uVar3;
    uVar8 = uVar8 ^ uVar3 ^ P2V[p];
    P2V[p] = uVar8;
    P2V[iVar2] = P2V[iVar2] ^ uVar8;
  }
  return;
}

Assistant:

static inline void Abc_TtMoveVar( word * pF, int nVars, int * V2P, int * P2V, int v, int p )
{
    int iVar = V2P[v], jVar = p;
    if ( iVar == jVar )
        return;
    Abc_TtSwapVars( pF, nVars, iVar, jVar );
    V2P[P2V[iVar]] = jVar;
    V2P[P2V[jVar]] = iVar;
    P2V[iVar] ^= P2V[jVar];
    P2V[jVar] ^= P2V[iVar];
    P2V[iVar] ^= P2V[jVar];
}